

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::count_lines(Fl_Text_Buffer *this,int startPos,int endPos)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int local_28;
  int pos;
  int lineCount;
  int gapLen;
  int endPos_local;
  int startPos_local;
  Fl_Text_Buffer *this_local;
  
  local_28 = 0;
  local_2c = startPos;
  while (local_2c < this->mGapStart) {
    if (local_2c == endPos) {
      return local_28;
    }
    iVar2 = local_2c + 1;
    lVar1 = (long)local_2c;
    local_2c = iVar2;
    if (this->mBuf[lVar1] == '\n') {
      local_28 = local_28 + 1;
    }
  }
  while( true ) {
    if (this->mLength <= local_2c) {
      return local_28;
    }
    if (local_2c == endPos) break;
    iVar3 = local_2c + 1;
    iVar2 = local_2c + (this->mGapEnd - this->mGapStart);
    local_2c = iVar3;
    if (this->mBuf[iVar2] == '\n') {
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int Fl_Text_Buffer::count_lines(int startPos, int endPos) const {
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED2(this, (endPos))
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = 0;
  
  int pos = startPos;
  while (pos < mGapStart)
  {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++] == '\n')
      lineCount++;
  } 
  while (pos < mLength) {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++ + gapLen] == '\n')
      lineCount++;
  }
  return lineCount;
}